

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O0

bool track_stat(stat_history_t *stat,uint64_t lat)

{
  long in_RSI;
  long in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  if (in_RSI == 0xffffffff) {
    bVar1 = false;
  }
  else if (in_RDI == 0) {
    bVar1 = false;
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)lat,
               (value_type *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool track_stat(stat_history_t *stat, uint64_t lat) {

    if (lat == (uint64_t)ERR_NS) {
      return false;
    }

    if (stat) {
        stat->latencies.push_back(lat);
        return true;
    } else {
        return false;
    }
}